

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TElasticity2DAnalytic::TElasticity2DAnalytic(TElasticity2DAnalytic *this,TElasticity2DAnalytic *cp)

{
  long in_RSI;
  TPZAnalyticSolution *in_RDI;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  TPZAnalyticSolution *in_stack_ffffffffffffffe0;
  
  TPZAnalyticSolution::TPZAnalyticSolution(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI->_vptr_TPZAnalyticSolution = (_func_int **)&PTR__TElasticity2DAnalytic_025a3230;
  *(undefined4 *)&in_RDI->field_0xc = *(undefined4 *)(in_RSI + 0xc);
  *(undefined4 *)&in_RDI[1]._vptr_TPZAnalyticSolution = 1;
  std::operator<<((ostream *)&std::cout,
                  "TElasticity2DAnalytic::TElasticity2DAnalytic(const TElasticity2DAnalytic &cp): One should not invoke this copy constructor"
                 );
  pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  return;
}

Assistant:

TElasticity2DAnalytic::TElasticity2DAnalytic(const TElasticity2DAnalytic &cp) : TPZAnalyticSolution(cp),fProblemType(cp.fProblemType) {
    std::cout << "TElasticity2DAnalytic::TElasticity2DAnalytic(const TElasticity2DAnalytic &cp): One should not invoke this copy constructor";
    DebugStop();
}